

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b3D_integrator.cpp
# Opt level: O2

void __thiscall
NetworkNS::cb3D_integrator::calculate_pressure(cb3D_integrator *this,double *press_tens)

{
  uint uVar1;
  double **ppdVar2;
  double *pdVar3;
  uint j;
  long lVar4;
  uint i;
  ulong uVar5;
  uint j_1;
  
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    press_tens[lVar4] = 0.0;
  }
  uVar1 = this->dofs;
  ppdVar2 = this->bd_stress;
  for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
    pdVar3 = ppdVar2[uVar5];
    for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
      press_tens[lVar4] = pdVar3[lVar4] + press_tens[lVar4];
    }
  }
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    press_tens[lVar4] = press_tens[lVar4] * 16388.244964541722;
  }
  return;
}

Assistant:

void cb3D_integrator::calculate_pressure(double *press_tens){
      /** A function which accumulates the per-atom stresses in order to calculate the pressure
       *  of the simulation box.
       */

      // Initialize the pressure tensor to zero.
      for (unsigned int j = 0; j < 6; j++)
         press_tens[j] = 0.0;
      
      /** The per-atom stress is the negative of the per-atom pressure tensor. It is also really a 
       *  stress*volume formulation, meaning the computed quantity is in units of pressure*volume:
       * @f[\frac{\rm kJ}{\rm mol} = \frac{10^{33}}{6.022 \times 10^{23}} 
       *    \frac{\rm kg}{\rm m\: s^2} @f]
       * Thus, if the diagonal components of the per-atom stress tensor are summed for all beads in 
       * the system and the sum is divided by @f$3 V@f$, where @f$ V @f$  is the volume of the 
       * system, the result should be @f$ -p @f$, where @f$ p @f$ is the total pressure of the 
       * system.
       */ 
      
      // Accumulated the per-atom pressures to the global tensor:
      for (unsigned int i = 0; i < dofs; i++)
         for (unsigned int j = 0; j < 6; j++)
            press_tens[j] += bd_stress[i][j];
      
      // Convert per-atom pressure*vol in atm*Angstrom
      // An interesting thread concerning loop unrolling in C++: 
      // http://stackoverflow.com/questions/15275023/clang-force-loop-unroll-for-specific-loop
      for (unsigned int j = 0; j < 6; j++)
         press_tens[j] *= 1.e33 / avogadro_constant / 101.325e3;
      
      return;
   }